

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3IdListDelete(sqlite3 *db,IdList *pList)

{
  long lVar1;
  IdList_item *pIVar2;
  
  if (pList != (IdList *)0x0) {
    if (0 < pList->nId) {
      pIVar2 = pList->a;
      lVar1 = 0;
      do {
        if (pIVar2->zName != (char *)0x0) {
          sqlite3DbFreeNN(db,pIVar2->zName);
        }
        lVar1 = lVar1 + 1;
        pIVar2 = pIVar2 + 1;
      } while (lVar1 < pList->nId);
    }
    sqlite3DbFreeNN(db,pList);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3IdListDelete(sqlite3 *db, IdList *pList){
  int i;
  if( pList==0 ) return;
  assert( pList->eU4!=EU4_EXPR ); /* EU4_EXPR mode is not currently used */
  for(i=0; i<pList->nId; i++){
    sqlite3DbFree(db, pList->a[i].zName);
  }
  sqlite3DbFreeNN(db, pList);
}